

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,ObjectComprehension *comp)

{
  bool bVar1;
  int iVar2;
  reference field_00;
  Fodder *fodder;
  long in_RSI;
  FixNewlines *in_RDI;
  ComprehensionSpec *spec;
  iterator __end2_1;
  iterator __begin2_1;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__range2_1;
  ObjectField *field;
  iterator __end2;
  iterator __begin2;
  ObjectFields *__range2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
  local_48;
  Fodder *in_stack_ffffffffffffffc0;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_28;
  long local_20;
  long local_18;
  
  local_20 = in_RSI + 0x80;
  local_18 = in_RSI;
  local_28._M_current =
       (ObjectField *)
       std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
       ::begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                *)in_stack_ffffffffffffff98);
  std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::end
            ((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                        *)in_RDI,
                       (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      fodder = (Fodder *)(local_18 + 0xa0);
      local_48._M_current =
           (ComprehensionSpec *)
           std::
           vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ::begin(in_stack_ffffffffffffff98);
      std::
      vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ::end(in_stack_ffffffffffffff98);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                            *)in_RDI,
                           (__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                            *)in_stack_ffffffffffffff98);
        if (!bVar1) {
          iVar2 = countNewlines(fodder);
          return 0 < iVar2;
        }
        __gnu_cxx::
        __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
        ::operator*(&local_48);
        iVar2 = countNewlines(fodder);
        if (0 < iVar2) break;
        __gnu_cxx::
        __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
        ::operator++(&local_48);
      }
      return true;
    }
    field_00 = __gnu_cxx::
               __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
               ::operator*(&local_28);
    objectFieldOpenFodder(in_RDI,field_00);
    iVar2 = countNewlines(in_stack_ffffffffffffffc0);
    if (0 < iVar2) break;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool shouldExpand(ObjectComprehension *comp)
    {
        for (auto &field : comp->fields) {
            if (countNewlines(objectFieldOpenFodder(field)) > 0) {
                return true;
            }
        }
        for (auto &spec : comp->specs) {
            if (countNewlines(spec.openFodder) > 0) {
                return true;
            }
        }
        if (countNewlines(comp->closeFodder) > 0) {
            return true;
        }
        return false;
    }